

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles2::Functional::anon_unknown_0::requireShaderCompiler
               (TestContext *testCtx,CallLogWrapper *gl)

{
  CallLogWrapper *this;
  bool bVar1;
  uchar *puVar2;
  NotSupportedError *this_00;
  allocator<char> local_41;
  string local_40;
  StateQueryMemoryWriteGuard<unsigned_char> local_1b;
  CallLogWrapper *pCStack_18;
  StateQueryMemoryWriteGuard<unsigned_char> state;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  pCStack_18 = gl;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::StateQueryMemoryWriteGuard
            (&local_1b);
  this = pCStack_18;
  puVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::operator&
                     (&local_1b);
  glu::CallLogWrapper::glGetBooleanv(this,0x8dfa,puVar2);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity
                    (&local_1b,testCtx);
  if ((bVar1) &&
     (puVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
               operator_cast_to_unsigned_char_((StateQueryMemoryWriteGuard *)&local_1b),
     *puVar2 == '\x01')) {
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Test requires SHADER_COMPILER = TRUE",&local_41);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void requireShaderCompiler (tcu::TestContext& testCtx, glu::CallLogWrapper& gl)
{
	StateQueryMemoryWriteGuard<GLboolean> state;
	gl.glGetBooleanv(GL_SHADER_COMPILER, &state);

	if (!state.verifyValidity(testCtx) || state != GL_TRUE)
		throw tcu::NotSupportedError("Test requires SHADER_COMPILER = TRUE");
}